

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::python::Generator::PrintDescriptor
          (Generator *this,Descriptor *message_descriptor)

{
  char *pcVar1;
  Printer *pPVar2;
  mapped_type *pmVar3;
  long lVar4;
  int i;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  byte bVar9;
  DescriptorProto edp;
  string options_string;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  char required_function_arguments [91];
  string local_1c8;
  undefined1 local_1a8 [160];
  string local_108;
  string local_e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  char local_98 [88];
  undefined2 local_40;
  undefined1 local_3e;
  
  bVar9 = 0;
  PrintNestedDescriptors(this,message_descriptor);
  io::Printer::Print(this->printer_,"\n");
  pPVar2 = this->printer_;
  ModuleLevelDescriptorName<google::protobuf::Descriptor>
            ((string *)local_1a8,this,message_descriptor);
  io::Printer::Print(pPVar2,"$descriptor_name$ = _descriptor.Descriptor(\n","descriptor_name",
                     (string *)local_1a8);
  pcVar1 = local_1a8 + 0x10;
  if ((char *)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  io::Printer::Indent(this->printer_);
  local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._M_impl.super__Rb_tree_header._M_header;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1a8._0_8_ = pcVar1;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"name","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_c8,(key_type *)local_1a8);
  std::__cxx11::string::_M_assign((string *)pmVar3);
  if ((char *)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"full_name","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_c8,(key_type *)local_1a8);
  std::__cxx11::string::_M_assign((string *)pmVar3);
  if ((char *)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"file","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_c8,(key_type *)local_1a8);
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,(char *)pmVar3->_M_string_length,0x246a80);
  if ((char *)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pcVar6 = 
  "name=\'$name$\',\nfull_name=\'$full_name$\',\nfilename=None,\nfile=$file$,\ncontaining_type=None,\n"
  ;
  pcVar7 = local_98;
  for (lVar4 = 0xb; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)pcVar7 = *(undefined8 *)pcVar6;
    pcVar6 = pcVar6 + ((ulong)bVar9 * -2 + 1) * 8;
    pcVar7 = pcVar7 + (ulong)bVar9 * -0x10 + 8;
  }
  local_3e = 0;
  local_40 = 0xa2c;
  io::Printer::Print(this->printer_,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_c8,local_98);
  PrintFieldsInDescriptor(this,message_descriptor);
  PrintExtensionsInDescriptor(this,message_descriptor);
  io::Printer::Print(this->printer_,"nested_types=[");
  if (0 < *(int *)(message_descriptor + 0x38)) {
    lVar4 = 0;
    lVar8 = 0;
    do {
      ModuleLevelDescriptorName<google::protobuf::Descriptor>
                ((string *)local_1a8,this,
                 (Descriptor *)(*(long *)(message_descriptor + 0x40) + lVar4));
      io::Printer::Print(this->printer_,"$name$, ","name",(string *)local_1a8);
      if ((char *)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      lVar8 = lVar8 + 1;
      lVar4 = lVar4 + 0x78;
    } while (lVar8 < *(int *)(message_descriptor + 0x38));
  }
  io::Printer::Print(this->printer_,"],\n");
  io::Printer::Print(this->printer_,"enum_types=[\n");
  io::Printer::Indent(this->printer_);
  if (0 < *(int *)(message_descriptor + 0x48)) {
    lVar8 = 0;
    lVar4 = 0;
    do {
      ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>
                ((string *)local_1a8,this,
                 (EnumDescriptor *)(*(long *)(message_descriptor + 0x50) + lVar8));
      io::Printer::Print(this->printer_,(char *)local_1a8._0_8_);
      io::Printer::Print(this->printer_,",\n");
      if ((char *)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      lVar4 = lVar4 + 1;
      lVar8 = lVar8 + 0x38;
    } while (lVar4 < *(int *)(message_descriptor + 0x48));
  }
  io::Printer::Outdent(this->printer_);
  io::Printer::Print(this->printer_,"],\n");
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  MessageLite::SerializeToString(*(MessageLite **)(message_descriptor + 0x20),&local_108);
  pPVar2 = this->printer_;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"MessageOptions","");
  OptionsValue((string *)local_1a8,this,&local_1c8,&local_108);
  pcVar6 = "False";
  if (0 < *(int *)(message_descriptor + 0x58)) {
    pcVar6 = "True";
  }
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,pcVar6,
             pcVar6 + ((ulong)(0 < *(int *)(message_descriptor + 0x58)) ^ 5));
  io::Printer::Print(pPVar2,"options=$options_value$,\nis_extendable=$extendable$","options_value",
                     (string *)local_1a8,"extendable",&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  io::Printer::Print(this->printer_,",\n");
  io::Printer::Print(this->printer_,"extension_ranges=[");
  if (0 < *(int *)(message_descriptor + 0x58)) {
    lVar4 = 0;
    uVar5 = extraout_RDX;
    do {
      lVar8 = *(long *)(message_descriptor + 0x60);
      pPVar2 = this->printer_;
      SimpleItoa_abi_cxx11_
                ((string *)local_1a8,(protobuf *)(ulong)*(uint *)(lVar8 + lVar4 * 8),(int)uVar5);
      SimpleItoa_abi_cxx11_(&local_1c8,(protobuf *)(ulong)*(uint *)(lVar8 + 4 + lVar4 * 8),i);
      io::Printer::Print(pPVar2,"($start$, $end$), ","start",(string *)local_1a8,"end",&local_1c8);
      uVar5 = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        uVar5 = extraout_RDX_01;
      }
      if ((char *)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        uVar5 = extraout_RDX_02;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < *(int *)(message_descriptor + 0x58));
  }
  io::Printer::Print(this->printer_,"],\n");
  DescriptorProto::DescriptorProto((DescriptorProto *)local_1a8);
  PrintSerializedPbInterval<google::protobuf::Descriptor,google::protobuf::DescriptorProto>
            (this,message_descriptor,(DescriptorProto *)local_1a8);
  io::Printer::Outdent(this->printer_);
  io::Printer::Print(this->printer_,")\n");
  DescriptorProto::~DescriptorProto((DescriptorProto *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_c8);
  return;
}

Assistant:

void Generator::PrintDescriptor(const Descriptor& message_descriptor) const {
  PrintNestedDescriptors(message_descriptor);

  printer_->Print("\n");
  printer_->Print("$descriptor_name$ = _descriptor.Descriptor(\n",
                  "descriptor_name",
                  ModuleLevelDescriptorName(message_descriptor));
  printer_->Indent();
  map<string, string> m;
  m["name"] = message_descriptor.name();
  m["full_name"] = message_descriptor.full_name();
  m["file"] = kDescriptorKey;
  const char required_function_arguments[] =
      "name='$name$',\n"
      "full_name='$full_name$',\n"
      "filename=None,\n"
      "file=$file$,\n"
      "containing_type=None,\n";
  printer_->Print(m, required_function_arguments);
  PrintFieldsInDescriptor(message_descriptor);
  PrintExtensionsInDescriptor(message_descriptor);

  // Nested types
  printer_->Print("nested_types=[");
  for (int i = 0; i < message_descriptor.nested_type_count(); ++i) {
    const string nested_name = ModuleLevelDescriptorName(
        *message_descriptor.nested_type(i));
    printer_->Print("$name$, ", "name", nested_name);
  }
  printer_->Print("],\n");

  // Enum types
  printer_->Print("enum_types=[\n");
  printer_->Indent();
  for (int i = 0; i < message_descriptor.enum_type_count(); ++i) {
    const string descriptor_name = ModuleLevelDescriptorName(
        *message_descriptor.enum_type(i));
    printer_->Print(descriptor_name.c_str());
    printer_->Print(",\n");
  }
  printer_->Outdent();
  printer_->Print("],\n");
  string options_string;
  message_descriptor.options().SerializeToString(&options_string);
  printer_->Print(
      "options=$options_value$,\n"
      "is_extendable=$extendable$",
      "options_value", OptionsValue("MessageOptions", options_string),
      "extendable", message_descriptor.extension_range_count() > 0 ?
                      "True" : "False");
  printer_->Print(",\n");

  // Extension ranges
  printer_->Print("extension_ranges=[");
  for (int i = 0; i < message_descriptor.extension_range_count(); ++i) {
    const Descriptor::ExtensionRange* range =
        message_descriptor.extension_range(i);
    printer_->Print("($start$, $end$), ",
                    "start", SimpleItoa(range->start),
                    "end", SimpleItoa(range->end));
  }
  printer_->Print("],\n");

  // Serialization of proto
  DescriptorProto edp;
  PrintSerializedPbInterval(message_descriptor, edp);

  printer_->Outdent();
  printer_->Print(")\n");
}